

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O3

void __thiscall TestOutput::printFileAndLineForTestAndFailure(TestOutput *this,TestFailure *failure)

{
  int iVar1;
  char *pcVar2;
  SimpleString local_30;
  SimpleString local_28;
  SimpleString local_20;
  
  (*failure->_vptr_TestFailure[7])(&local_20);
  iVar1 = (*failure->_vptr_TestFailure[8])(failure);
  printErrorInFileOnLineFormattedForWorkingEnvironment(this,&local_20,iVar1);
  SimpleString::~SimpleString(&local_20);
  (*failure->_vptr_TestFailure[3])(&local_28,failure);
  (*this->_vptr_TestOutput[0xb])(this," Failure in ");
  pcVar2 = SimpleString::asCharString(&local_28);
  (*this->_vptr_TestOutput[0xb])(this,pcVar2);
  SimpleString::~SimpleString(&local_28);
  (*failure->_vptr_TestFailure[2])(&local_30,failure);
  iVar1 = (*failure->_vptr_TestFailure[5])(failure);
  printErrorInFileOnLineFormattedForWorkingEnvironment(this,&local_30,iVar1);
  SimpleString::~SimpleString(&local_30);
  return;
}

Assistant:

void TestOutput::printFileAndLineForTestAndFailure(const TestFailure& failure)
{
    printErrorInFileOnLineFormattedForWorkingEnvironment(failure.getTestFileName(), failure.getTestLineNumber());
    printFailureInTest(failure.getTestName());
    printErrorInFileOnLineFormattedForWorkingEnvironment(failure.getFileName(), failure.getFailureLineNumber());
}